

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

bool __thiscall capnp::_::PointerReader::isCanonical(PointerReader *this,word **readHead)

{
  undefined1 uVar1;
  PointerType PVar2;
  bool bVar3;
  bool ptrTrunc;
  bool dataTrunc;
  StructReader structReader;
  
  bVar3 = true;
  if (this->pointer != (WirePointer *)0x0) {
    if (((this->pointer->offsetAndKind).value & 2) == 0) {
      PVar2 = getPointerType(this);
      uVar1 = (*(code *)(&DAT_001939a8 + *(int *)(&DAT_001939a8 + (ulong)PVar2 * 4)))();
      return (bool)uVar1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PointerReader::isCanonical(const word **readHead) {
  if (!this->pointer) {
    // The pointer is null, so we are canonical and do not read
    return true;
  }

  if (!this->pointer->isPositional()) {
    // The pointer is a FAR or OTHER pointer, and is non-canonical
    return false;
  }

  switch (this->getPointerType()) {
    case PointerType::NULL_:
      // The pointer is null, we are canonical and do not read
      return true;
    case PointerType::STRUCT: {
      bool dataTrunc, ptrTrunc;
      auto structReader = this->getStruct(nullptr);
      if (structReader.getDataSectionSize() == ZERO * BITS &&
          structReader.getPointerSectionSize() == ZERO * POINTERS) {
        return reinterpret_cast<const word*>(this->pointer) == structReader.getLocation();
      } else {
        return structReader.isCanonical(readHead, readHead, &dataTrunc, &ptrTrunc) && dataTrunc && ptrTrunc;
      }
    }
    case PointerType::LIST:
      return this->getListAnySize(nullptr).isCanonical(readHead, pointer);
    case PointerType::CAPABILITY:
      KJ_FAIL_ASSERT("Capabilities are not positional");
  }
  KJ_UNREACHABLE;
}